

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::QueueUserAPC
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CPalThread *pthrTarget,
          PAPCFUNC pfnAPC,ULONG_PTR uptrData)

{
  bool bVar1;
  bool bVar2;
  THREAD_STATE TVar3;
  uint uVar4;
  LONG LVar5;
  ThreadWaitInfo *ptwiWaitInfo;
  uint *pt;
  bool fHaveSharedLock;
  bool fThreadLock;
  bool fSharedSynchLock;
  bool fLocalSynchLock;
  ThreadWaitInfo *pTargetTWInfo;
  DWORD *pdwWaitState;
  _ThreadApcInfoNode *p_Stack_40;
  DWORD dwWaitState;
  ThreadApcInfoNode *ptainNode;
  PAL_ERROR palErr;
  ULONG_PTR uptrData_local;
  PAPCFUNC pfnAPC_local;
  CPalThread *pthrTarget_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  ptainNode._4_4_ = 0;
  ptwiWaitInfo = GetThreadWaitInfo(pthrTarget);
  bVar2 = false;
  fHaveSharedLock = false;
  bVar1 = false;
  p_Stack_40 = CSynchCache<CorUnix::_ThreadApcInfoNode>::Get
                         (&this->m_cacheThreadApcInfoNodes,pthrCurrent);
  if (p_Stack_40 == (_ThreadApcInfoNode *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    ptainNode._4_4_ = 8;
  }
  else {
    p_Stack_40->pfnAPC = pfnAPC;
    p_Stack_40->pAPCData = uptrData;
    p_Stack_40->pNext = (_ThreadApcInfoNode *)0x0;
    AcquireLocalSynchLock(pthrCurrent);
    bVar2 = true;
    fHaveSharedLock = ptwiWaitInfo->wdWaitDomain != LocalWait;
    if (fHaveSharedLock) {
      AcquireSharedSynchLock(pthrCurrent);
    }
    CPalThread::Lock(pthrTarget,pthrCurrent);
    bVar1 = true;
    TVar3 = CThreadSynchronizationInfo::GetThreadState(&pthrTarget->synchronizationInfo);
    if (TVar3 == TS_DONE) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CPalThread::GetThreadId(pthrTarget);
      ptainNode._4_4_ = 0x57;
    }
    else {
      pt = (uint *)SHMPtrToPtr((pthrTarget->synchronizationInfo).m_shridWaitAwakened);
      uVar4 = VolatileLoad<unsigned_int>(pt);
      if (uVar4 == 3) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        CPalThread::GetThreadId(pthrTarget);
        ptainNode._4_4_ = 0x57;
      }
      else {
        if ((pthrTarget->apcInfo).m_ptainTail == (PThreadApcInfoNode)0x0) {
          if ((pthrTarget->apcInfo).m_ptainHead != (PThreadApcInfoNode)0x0) {
            fprintf(_stderr,"] %s %s:%d","QueueUserAPC",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                    ,0x506);
            fprintf(_stderr,
                    "Expression: NULL == pthrTarget->apcInfo.m_ptainHead, Description: Corrupted APC list\n"
                   );
          }
          (pthrTarget->apcInfo).m_ptainHead = p_Stack_40;
          (pthrTarget->apcInfo).m_ptainTail = p_Stack_40;
        }
        else {
          ((pthrTarget->apcInfo).m_ptainTail)->pNext = p_Stack_40;
          (pthrTarget->apcInfo).m_ptainTail = p_Stack_40;
        }
        p_Stack_40 = (_ThreadApcInfoNode *)0x0;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        LVar5 = InterlockedCompareExchange((LONG *)pt,0,2);
        CPalThread::Unlock(pthrTarget,pthrCurrent);
        bVar1 = false;
        if (LVar5 == 2) {
          UnRegisterWait(this,pthrCurrent,ptwiWaitInfo,fHaveSharedLock);
          ptainNode._4_4_ = WakeUpLocalThread(pthrCurrent,pthrTarget,Alerted,0);
          if (ptainNode._4_4_ != 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            CPalThread::GetThreadId(pthrTarget);
          }
        }
      }
    }
  }
  if (bVar1) {
    CPalThread::Unlock(pthrTarget,pthrCurrent);
  }
  if (fHaveSharedLock) {
    ReleaseSharedSynchLock(pthrCurrent);
  }
  if (bVar2) {
    ReleaseLocalSynchLock(pthrCurrent);
  }
  if (p_Stack_40 != (_ThreadApcInfoNode *)0x0) {
    CSynchCache<CorUnix::_ThreadApcInfoNode>::Add
              (&this->m_cacheThreadApcInfoNodes,pthrCurrent,p_Stack_40);
  }
  return ptainNode._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::QueueUserAPC(CPalThread * pthrCurrent,
        CPalThread * pthrTarget,
        PAPCFUNC pfnAPC,
        ULONG_PTR uptrData)
    {
        PAL_ERROR palErr = NO_ERROR;
        ThreadApcInfoNode * ptainNode = NULL;
        DWORD dwWaitState;
        DWORD * pdwWaitState;
        ThreadWaitInfo * pTargetTWInfo = GetThreadWaitInfo(pthrTarget);
        bool fLocalSynchLock = false;
        bool fSharedSynchLock = false;
        bool fThreadLock = false;

        ptainNode = m_cacheThreadApcInfoNodes.Get(pthrCurrent);
        if (NULL == ptainNode)
        {
            ERROR("No memory for new APCs linked list entry\n");
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto QUAPC_exit;
        }

        ptainNode->pfnAPC = pfnAPC;
        ptainNode->pAPCData = uptrData;
        ptainNode->pNext = NULL;

        AcquireLocalSynchLock(pthrCurrent);
        fLocalSynchLock = true;

        if (LocalWait != pTargetTWInfo->wdWaitDomain)
        {
            AcquireSharedSynchLock(pthrCurrent);
            fSharedSynchLock = true;
        }

        pthrTarget->Lock(pthrCurrent);
        fThreadLock = true;

        if(TS_DONE == pthrTarget->synchronizationInfo.GetThreadState())
        {
            ERROR("Thread %#x has terminated; can't queue an APC on it\n",
                  pthrTarget->GetThreadId());
            palErr = ERROR_INVALID_PARAMETER;
            goto QUAPC_exit;
        }
        pdwWaitState = SharedIDToTypePointer(DWORD,
            pthrTarget->synchronizationInfo.m_shridWaitAwakened);
        if(TWS_EARLYDEATH == VolatileLoad(pdwWaitState))
        {
            ERROR("Thread %#x is about to be suspended for process shutdown, "
                  "can't queue an APC on it\n", pthrTarget->GetThreadId());
            palErr = ERROR_INVALID_PARAMETER;
            goto QUAPC_exit;
        }

        if (NULL == pthrTarget->apcInfo.m_ptainTail)
        {
            _ASSERT_MSG(NULL == pthrTarget->apcInfo.m_ptainHead,
                        "Corrupted APC list\n");

            pthrTarget->apcInfo.m_ptainHead = ptainNode;
            pthrTarget->apcInfo.m_ptainTail = ptainNode;
        }
        else
        {
            pthrTarget->apcInfo.m_ptainTail->pNext = ptainNode;
            pthrTarget->apcInfo.m_ptainTail = ptainNode;
        }

        // Set ptainNode to NULL so it won't be readded to the cache
        ptainNode = NULL;

        TRACE("APC %p with parameter %p added to APC queue\n",
             pfnAPC, uptrData);

        dwWaitState = InterlockedCompareExchange((LONG *)pdwWaitState,
                                                 (LONG)TWS_ACTIVE,
                                                 (LONG)TWS_ALERTABLE);

        // Release thread lock
        pthrTarget->Unlock(pthrCurrent);
        fThreadLock = false;

        if(TWS_ALERTABLE == dwWaitState)
        {
            // Unregister the wait
            UnRegisterWait(pthrCurrent, pTargetTWInfo, fSharedSynchLock);

            // Wake up target thread
            palErr = WakeUpLocalThread(
                pthrCurrent,
                pthrTarget,
                Alerted,
                0);

            if (NO_ERROR != palErr)
            {
                ERROR("Failed to wakeup local thread %#x for dispatching "
                      "APCs [err=%u]\n", pthrTarget->GetThreadId(),
                      palErr);
            }
        }

    QUAPC_exit:
        if (fThreadLock)
        {
            pthrTarget->Unlock(pthrCurrent);
        }
        if (fSharedSynchLock)
        {
            ReleaseSharedSynchLock(pthrCurrent);
        }
        if (fLocalSynchLock)
        {
            ReleaseLocalSynchLock(pthrCurrent);
        }
        if (ptainNode)
        {
            m_cacheThreadApcInfoNodes.Add(pthrCurrent, ptainNode);
        }
        return palErr;
    }